

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcolor.cpp
# Opt level: O0

void test_colors(wins *wins_ar,int ar_len)

{
  char *local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  Am_Style *local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined8 local_60;
  Am_Style *local_58;
  Am_Drawonable *local_50;
  undefined1 *local_48;
  Am_Drawonable *local_40;
  Am_Style local_28 [8];
  Am_Drawonable *local_20;
  Am_Drawonable *the_color_win;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  the_color_win._4_4_ = ar_len;
  _i = wins_ar;
  for (the_color_win._0_4_ = 0; (int)the_color_win < the_color_win._4_4_;
      the_color_win._0_4_ = (int)the_color_win + 1) {
    local_50 = _i[(int)the_color_win].root;
    local_58 = local_28;
    Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
    local_b0 = local_58;
    local_c8 = "";
    local_60 = 0;
    local_68 = 1;
    local_70 = 0;
    local_78 = 0;
    local_80 = 1;
    local_88 = 0;
    local_90 = 0;
    local_98 = 1;
    local_a0 = 1;
    local_a8 = 0;
    local_b8 = 0;
    local_c0 = 1;
    local_48 = (undefined1 *)&local_c8;
    local_40 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_50)(local_50,10,0x32,300,0x1e0);
    Am_Style::~Am_Style(local_28);
    local_20 = local_40;
    _i[(int)the_color_win].color_win = local_40;
    draw_colors(local_40);
    (**(code **)(*(long *)local_20 + 0xa0))();
  }
  return;
}

Assistant:

void
test_colors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *the_color_win = (wins_ar[i].root)->Create(10, 50, 300, 480);
    wins_ar[i].color_win = the_color_win;
    draw_colors(the_color_win);
    the_color_win->Flush_Output();
  }
}